

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoSwitches.hpp
# Opt level: O1

void __thiscall
Apple::II::VideoSwitches<Cycles>::set_80_columns(VideoSwitches<Cycles> *this,bool columns_80)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  (this->external_).columns_80 = columns_80;
  local_28._9_7_ = 0;
  local_28._M_pod_data[8] = columns_80;
  pcStack_10 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/AppleII/VideoSwitches.hpp:112:28)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/AppleII/VideoSwitches.hpp:112:28)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  DeferredQueue<Cycles>::defer
            (&(this->deferrer_).super_DeferredQueue<Cycles>,
             (Cycles)(this->delay_).super_WrappedInt<Cycles>.length_,(function<void_()> *)&local_28)
  ;
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void set_80_columns(bool columns_80) {
			external_.columns_80 = columns_80;
			deferrer_.defer(delay_, [this, columns_80] {
				internal_.columns_80 = columns_80;
			});
		}